

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.h
# Opt level: O2

string * __thiscall
wabt::IndexToAlphaName_abi_cxx11_(string *__return_storage_ptr__,wabt *this,Index index)

{
  uint uVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar2 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    uVar1 = (uint)uVar2;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    uVar2 = (ulong)((int)(uVar2 / 0x1a) - 1);
  } while (0x19 < uVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string IndexToAlphaName(Index index) {
  std::string s;
  do {
    // For multiple chars, put most frequently changing char first.
    s += 'a' + (index % 26);
    index /= 26;
    // Continue remaining sequence with 'a' rather than 'b'.
  } while (index--);
  return s;
}